

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp.c
# Opt level: O1

int tcptran_listener_init(void *arg,nng_url *url,nni_listener *nlistener)

{
  int iVar1;
  nni_sock *sock;
  
  sock = nni_listener_sock(nlistener);
  *(nni_listener **)((long)arg + 0x420) = nlistener;
  tcptran_ep_init((tcptran_ep *)arg,sock,tcptran_accept_cb);
  if ((*url->u_path != '\0') && (iVar1 = strcmp(url->u_path,"/"), iVar1 != 0)) {
    return 0xf;
  }
  iVar1 = 0xf;
  if ((((url->u_fragment == (char *)0x0) && (url->u_userinfo == (char *)0x0)) &&
      (url->u_query == (char *)0x0)) &&
     (iVar1 = nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x418),url),
     iVar1 == 0)) {
    nni_listener_add_stat(nlistener,(nni_stat_item *)((long)arg + 0x430));
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int
tcptran_listener_init(void *arg, nng_url *url, nni_listener *nlistener)
{
	tcptran_ep *ep = arg;
	int         rv;
	nni_sock   *sock = nni_listener_sock(nlistener);

	ep->nlistener = nlistener;
	tcptran_ep_init(ep, sock, tcptran_accept_cb);

	// Check for invalid URL components.
	if ((strlen(url->u_path) != 0) && (strcmp(url->u_path, "/") != 0)) {
		return (NNG_EADDRINVAL);
	}
	if ((url->u_fragment != NULL) || (url->u_userinfo != NULL) ||
	    (url->u_query != NULL)) {
		return (NNG_EADDRINVAL);
	}

	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		return (rv);
	}
#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(nlistener, &ep->st_rcv_max);
#endif

	return (0);
}